

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

RegOpnd * __thiscall Inline::GetCallbackFunctionOpnd(Inline *this,Instr *callInstr)

{
  StackSym *pSVar1;
  PropertySymOpnd *this_00;
  RegOpnd *pRVar2;
  Instr *pIVar3;
  Instr *pIVar4;
  
  pSVar1 = IR::Opnd::GetStackSym(callInstr->m_src1);
  pIVar4 = (Instr *)0x0;
  pIVar3 = (Instr *)0x0;
  if ((pSVar1->field_0x18 & 1) != 0) {
    pIVar3 = (pSVar1->field_5).m_instrDef;
  }
  this_00 = IR::Opnd::AsPropertySymOpnd(pIVar3->m_src1);
  pSVar1 = IR::PropertySymOpnd::GetObjectSym(this_00);
  if ((pSVar1->field_0x18 & 1) != 0) {
    pIVar4 = (pSVar1->field_5).m_instrDef;
  }
  pRVar2 = IR::Opnd::AsRegOpnd(pIVar4->m_dst);
  return pRVar2;
}

Assistant:

IR::RegOpnd * Inline::GetCallbackFunctionOpnd(IR::Instr * callInstr)
{
    IR::Instr * callApplyLdInstr = callInstr->GetSrc1()->GetStackSym()->GetInstrDef();
    IR::Instr * targetDefInstr = callApplyLdInstr->GetSrc1()->AsPropertySymOpnd()->GetObjectSym()->GetInstrDef();
    return targetDefInstr->GetDst()->AsRegOpnd();
}